

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O3

int Sle_ManComputeDelay(Gia_Man_t *p,Vec_Int_t *vCuts)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vTime;
  Gia_Man_t *__s;
  Gia_Man_t *p_00;
  long lVar4;
  long lVar5;
  
  iVar3 = p->nObjs;
  p_00 = (Gia_Man_t *)&DAT_00000010;
  vTime = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar2 = iVar3;
  }
  vTime->nCap = iVar2;
  if (iVar2 == 0) {
    vTime->pArray = (int *)0x0;
    vTime->nSize = iVar3;
  }
  else {
    p_00 = (Gia_Man_t *)((long)iVar2 << 2);
    __s = (Gia_Man_t *)malloc((size_t)p_00);
    vTime->pArray = (int *)__s;
    vTime->nSize = iVar3;
    if (__s != (Gia_Man_t *)0x0) {
      p_00 = __s;
      memset(__s,0,(long)iVar3 << 2);
      goto LAB_007ba172;
    }
  }
  __s = (Gia_Man_t *)0x0;
LAB_007ba172:
  if (iVar3 < 1) {
    iVar2 = 0;
  }
  else {
    lVar5 = 0;
    lVar4 = 0;
    iVar2 = 0;
    do {
      uVar1 = *(uint *)(&p->pObjs->field_0x0 + lVar5);
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        iVar3 = Sle_ManComputeDelayOne(p_00,(int)lVar4,vCuts,vTime);
        if (iVar2 <= iVar3) {
          iVar2 = iVar3;
        }
        iVar3 = p->nObjs;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar4 < iVar3);
  }
  if (__s != (Gia_Man_t *)0x0) {
    free(__s);
  }
  free(vTime);
  return iVar2;
}

Assistant:

int Sle_ManComputeDelay( Gia_Man_t * p, Vec_Int_t * vCuts )
{
    int iObj, Delay, DelayMax = 0;
    Vec_Int_t * vTime = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAndId( p, iObj )
    {
        Delay = Sle_ManComputeDelayOne( p, iObj, vCuts, vTime );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    Vec_IntFree( vTime );
    //printf( "Delay = %d.\n", DelayMax );
    return DelayMax;
}